

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::extend<4ul,unsigned_short,unsigned_int,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  uint uVar1;
  reference this_00;
  reference this_01;
  Literal local_170;
  size_type local_158;
  size_t idx;
  size_t i;
  undefined1 local_138 [8];
  LaneArray<4UL> result;
  LaneArray<4UL_*_2> lanes;
  Literal *vec_local;
  
  getLanes<unsigned_short,8>((LaneArray<8> *)&result._M_elems[3].type,this,vec);
  std::array<wasm::Literal,_4UL>::array((array<wasm::Literal,_4UL> *)local_138);
  for (idx = 0; idx < 4; idx = idx + 1) {
    local_158 = idx + 4;
    this_00 = std::array<wasm::Literal,_8UL>::operator[]
                        ((array<wasm::Literal,_8UL> *)&result._M_elems[3].type,local_158);
    uVar1 = Literal::geti32(this_00);
    Literal::Literal(&local_170,uVar1 & 0xffff);
    this_01 = std::array<wasm::Literal,_4UL>::operator[]((array<wasm::Literal,_4UL> *)local_138,idx)
    ;
    Literal::operator=(this_01,&local_170);
    Literal::~Literal(&local_170);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<4> *)local_138);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_138);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&result._M_elems[3].type);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}